

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

void OPL_STATUS_SET(FM_OPL *OPL,int flag)

{
  byte bVar1;
  
  bVar1 = (byte)flag | OPL->status;
  OPL->status = bVar1;
  if ((-1 < (char)bVar1) && ((OPL->statusmask & bVar1) != 0)) {
    OPL->status = bVar1 | 0x80;
    if (OPL->IRQHandler != (OPL_IRQHANDLER)0x0) {
      (*OPL->IRQHandler)(OPL->IRQParam,'\x01');
      return;
    }
  }
  return;
}

Assistant:

INLINE void OPL_STATUS_SET(FM_OPL *OPL,int flag)
{
	/* set status flag */
	OPL->status |= flag;
	if(!(OPL->status & 0x80))
	{
		if(OPL->status & OPL->statusmask)
		{	/* IRQ on */
			OPL->status |= 0x80;
			/* callback user interrupt handler (IRQ is OFF to ON) */
			if(OPL->IRQHandler) (OPL->IRQHandler)(OPL->IRQParam,1);
		}
	}
}